

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_cube__init_from
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *buffer;
  bool bVar1;
  uint32 uVar2;
  byte *pbVar3;
  StringHash SVar4;
  long lVar5;
  xmlChar *text;
  xmlChar **ppxVar6;
  bool failed;
  bool failed_1;
  bool local_3b;
  bool local_3a;
  bool local_39;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  pbVar3[0] = 0;
  pbVar3[1] = 0;
  pbVar3[2] = 0;
  pbVar3[3] = 0;
  pbVar3[4] = 7;
  pbVar3[5] = 0;
  pbVar3[6] = 0;
  pbVar3[7] = 0;
  pbVar3[8] = 0;
  pbVar3[9] = 0;
  pbVar3[10] = 0;
  pbVar3[0xb] = 0;
  pbVar3[0xc] = 0;
  pbVar3[0xd] = 0;
  pbVar3[0xe] = 0;
  pbVar3[0xf] = 0;
  *attributeDataPtr = pbVar3;
  ppxVar6 = attributes->attributes;
  if ((ppxVar6 != (xmlChar **)0x0) && (text = *ppxVar6, text != (xmlChar *)0x0)) {
    do {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar6[1];
      if (SVar4 == 0xf38d248) {
        uVar2 = GeneratedSaxParser::Utils::toUint32(buffer,&local_3a);
        *(uint32 *)(pbVar3 + 0xc) = uVar2;
        if (local_3a == true) {
          SVar4 = 0xf38d248;
LAB_007283ae:
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                             0xa5a90d,SVar4,buffer);
          if (bVar1) {
            return false;
          }
        }
      }
      else if (SVar4 == 0x6603ec8) {
        uVar2 = GeneratedSaxParser::Utils::toUint32(buffer,&local_3b);
        *(uint32 *)(pbVar3 + 8) = uVar2;
        if ((local_3b == true) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                               0xa5a90d,0x6603ec8,buffer), bVar1)) {
          return false;
        }
        if ((local_3b & 1U) == 0) {
          *pbVar3 = *pbVar3 | 1;
        }
      }
      else {
        if (SVar4 == 0x6c795) {
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash(buffer,&local_39);
          lVar5 = 8;
          do {
            if (*(StringHash *)(&UNK_00836fc8 + lVar5) == SVar4) {
              *(undefined4 *)(pbVar3 + 4) = *(undefined4 *)((long)&ENUM__image_face_enumMap + lVar5)
              ;
              goto LAB_007283f7;
            }
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x68);
          local_39 = true;
          pbVar3[4] = 6;
          pbVar3[5] = 0;
          pbVar3[6] = 0;
          pbVar3[7] = 0;
          SVar4 = 0x6c795;
          goto LAB_007283ae;
        }
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0xa5a90d,text
                           ,buffer);
        if (bVar1) {
          return false;
        }
      }
LAB_007283f7:
      ppxVar6 = ppxVar6 + 2;
      text = *ppxVar6;
    } while (text != (xmlChar *)0x0);
    if (*(int *)(pbVar3 + 4) != 7) goto LAB_00728435;
  }
  bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                    (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,0xa5a90d,
                     0x6c795,(ParserChar *)0x0);
  if (bVar1) {
    return false;
  }
LAB_00728435:
  if (((*pbVar3 & 1) == 0) &&
     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                         0xa5a90d,0x6603ec8,(ParserChar *)0x0), bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_cube__init_from( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_cube__init_from( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_cube__init_from__AttributeData* attributeData = newData<create_cube__init_from__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_FACE:
    {
bool failed;
attributeData->face = Utils::toEnum<ENUM__image_face_enum, StringHash, ENUM__image_face_enum__COUNT>(attributeValue, failed, ENUM__image_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INIT_FROM,
        HASH_ATTRIBUTE_FACE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_MIP_INDEX:
    {
bool failed;
attributeData->mip_index = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INIT_FROM,
        HASH_ATTRIBUTE_MIP_INDEX,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= create_cube__init_from__AttributeData::ATTRIBUTE_MIP_INDEX_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_ARRAY_INDEX:
    {
bool failed;
attributeData->array_index = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INIT_FROM,
        HASH_ATTRIBUTE_ARRAY_INDEX,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INIT_FROM, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->face == ENUM__image_face_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INIT_FROM, HASH_ATTRIBUTE_FACE, 0 ) )
        return false;
}
if ( (attributeData->present_attributes & create_cube__init_from__AttributeData::ATTRIBUTE_MIP_INDEX_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INIT_FROM, HASH_ATTRIBUTE_MIP_INDEX, 0 ) )
        return false;
}


    return true;
}